

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O0

void __thiscall libwebm::PesOptionalHeader::SetPtsBits(PesOptionalHeader *this,int64_t pts_90khz)

{
  uint uVar1;
  uint32_t pts3;
  uint32_t pts2;
  uint32_t pts1;
  int64_t pts_90khz_local;
  PesOptionalHeader *this_local;
  
  uVar1 = (uint)(pts_90khz >> 0xf) & 0x7fff;
  (this->pts).bits = 0;
  (this->pts).bits = (ulong)(((uint)pts_90khz & 0x7f) << 1) | (this->pts).bits;
  (this->pts).bits = (this->pts).bits | 1;
  (this->pts).bits = (this->pts).bits << 8;
  (this->pts).bits = (ulong)(((uint)pts_90khz & 0x7fff) >> 7) | (this->pts).bits;
  (this->pts).bits = (this->pts).bits << 8;
  (this->pts).bits = (ulong)(uVar1 << 1) | (this->pts).bits;
  (this->pts).bits = (this->pts).bits | 1;
  (this->pts).bits = (this->pts).bits << 8;
  (this->pts).bits = (ulong)(uVar1 >> 7) | (this->pts).bits;
  (this->pts).bits = (this->pts).bits << 8;
  (this->pts).bits = (this->pts).bits | 0x20;
  (this->pts).bits = (ulong)(((uint)(pts_90khz >> 0x1e) & 7) << 1) | (this->pts).bits;
  (this->pts).bits = (this->pts).bits | 1;
  return;
}

Assistant:

void PesOptionalHeader::SetPtsBits(std::int64_t pts_90khz) {
  // PTS is broken up and stored in 40 bits as shown:
  //
  //  PES PTS Only flag
  // /                  Marker              Marker              Marker
  // |                 /                   /                   /
  // |                 |                   |                   |
  // 7654  321         0  765432107654321  0  765432107654321  0
  // 0010  PTS 32-30   1  PTS 29-15        1  PTS 14-0         1
  const std::uint32_t pts1 = (pts_90khz >> 30) & 0x7;
  const std::uint32_t pts2 = (pts_90khz >> 15) & 0x7FFF;
  const std::uint32_t pts3 = pts_90khz & 0x7FFF;

  pts.bits = 0;

  // bottom 7 bits of second PTS chunk.
  pts.bits |= (pts3 << 1) & 0xff;
  // Marker.
  pts.bits |= 1;

  // Last 15 bits of pts and 1 bit marker.
  // Top 8 bits of second PTS chunk.
  pts.bits <<= 8;
  pts.bits |= (pts3 >> 7) & 0xff;

  // bottom 7 bits of second PTS chunk.
  pts.bits <<= 8;
  pts.bits |= (pts2 << 1);
  // Marker.
  pts.bits |= 1;

  // Next 15 bits of pts and 1 bit marker.
  // Top 8 bits of second PTS chunk.
  pts.bits <<= 8;
  pts.bits |= (pts2 >> 7) & 0xff;

  // PTS only flag.
  pts.bits <<= 8;
  pts.bits |= 1 << 5;
  // Top 3 bits of PTS and 1 bit marker.
  pts.bits |= pts1 << 1;
  // Marker.
  pts.bits |= 1;
}